

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

void process_player(void)

{
  byte *pbVar1;
  int16_t *piVar2;
  player *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  object *in_RAX;
  game_event_type type;
  source sVar6;
  source origin;
  
  player_resting_complete_special(player);
  event_signal(EVENT_CHECK_INTERRUPT);
  do {
    notice_stuff(player);
    handle_stuff(player);
    event_signal(EVENT_REFRESH);
    pack_overflow(in_RAX);
    ppVar3 = player;
    player->upkeep->energy_use = L'\0';
    _Var4 = flag_has_dbg((ppVar3->state).pflags,3,9,"player->state.pflags","(PF_SEE_ORE)");
    if (((((_Var4) && (piVar2 = player->timed, piVar2[6] == 0)) && (piVar2[4] == 0)) &&
        ((piVar2[0x19] == 0 && (piVar2[9] == 0)))) &&
       ((piVar2[3] == 0 && ((piVar2[0x1c] == 0 && (piVar2[5] == 0)))))) {
      sVar6 = source_none();
      origin.which = sVar6.which;
      origin._4_4_ = 0;
      origin.what = sVar6.what;
      effect_simple(L'\"',origin,"0",L'\0',L'\0',L'\0',L'\x03',L'\x03',(_Bool *)0x0);
    }
    if (player->timed[3] == 0) {
      _Var4 = player_timed_grade_eq(player,L'\t',"Knocked Out");
      if (_Var4) goto LAB_00145753;
    }
    else {
LAB_00145753:
      cmdq_push(CMD_SLEEP);
    }
    wVar5 = cmd_get_nrepeats();
    type = EVENT_COMMAND_REPEAT;
    if (wVar5 < L'\x01') {
      type = EVENT_REFRESH;
      if (player->upkeep->monster_race != (monster_race *)0x0) {
        pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
        *pbVar1 = *pbVar1 | 0x10;
      }
    }
    event_signal(type);
    _Var4 = cmdq_pop(CTX_GAME);
    if ((!_Var4) || (player->upkeep->playing != true)) {
LAB_001457d2:
      notice_stuff(player);
      return;
    }
    process_player_cleanup();
    if ((player->upkeep->energy_use != L'\0') ||
       ((player->is_dead != false || (player->upkeep->generate_level == true)))) goto LAB_001457d2;
  } while( true );
}

Assistant:

void process_player(void)
{
	/* Check for interrupts */
	player_resting_complete_special(player);
	event_signal(EVENT_CHECK_INTERRUPT);

	/* Repeat until energy is reduced */
	do {
		/* Refresh */
		notice_stuff(player);
		handle_stuff(player);
		event_signal(EVENT_REFRESH);

		/* Hack -- Pack Overflow */
		pack_overflow(NULL);

		/* Assume free turn */
		player->upkeep->energy_use = 0;

		/* Dwarves detect treasure */
		if (player_has(player, PF_SEE_ORE)) {
			/* Only if they are in good shape */
			if (!player->timed[TMD_IMAGE] &&
				!player->timed[TMD_CONFUSED] &&
				!player->timed[TMD_AMNESIA] &&
				!player->timed[TMD_STUN] &&
				!player->timed[TMD_PARALYZED] &&
				!player->timed[TMD_TERROR] &&
				!player->timed[TMD_AFRAID])
				effect_simple(EF_DETECT_ORE, source_none(), "0", 0, 0, 0, 3, 3, NULL);
		}

		/* Paralyzed or Knocked Out player gets no turn */
		if (player->timed[TMD_PARALYZED] ||
			player_timed_grade_eq(player, TMD_STUN, "Knocked Out")) {
			cmdq_push(CMD_SLEEP);
		}

		/* Prepare for the next command */
		if (cmd_get_nrepeats() > 0) {
			event_signal(EVENT_COMMAND_REPEAT);
		} else {
			/* Check monster recall */
			if (player->upkeep->monster_race)
				player->upkeep->redraw |= (PR_MONSTER);

			/* Place cursor on player/target */
			event_signal(EVENT_REFRESH);
		}

		/* Get a command from the queue if there is one */
		if (!cmdq_pop(CTX_GAME))
			break;

		if (!player->upkeep->playing)
			break;

		process_player_cleanup();
	} while (!player->upkeep->energy_use &&
			 !player->is_dead &&
			 !player->upkeep->generate_level);

	/* Notice stuff (if needed) */
	notice_stuff(player);
}